

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::iuUniversalPrinter<int[10]>::Print(int (*a) [10],iu_ostream *os)

{
  UniversalPrintArray<int>(*a,10,os);
  return;
}

Assistant:

static void Print(const T(&a)[SIZE], iu_ostream* os)
    {
        UniversalPrintArray(a, SIZE, os);
    }